

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::anon_unknown_0::
CommandLineInterfaceTest_PluginOutputDirectoryNotFoundError_Test::
CommandLineInterfaceTest_PluginOutputDirectoryNotFoundError_Test
          (CommandLineInterfaceTest_PluginOutputDirectoryNotFoundError_Test *this)

{
  CommandLineInterfaceTest_PluginOutputDirectoryNotFoundError_Test *this_local;
  
  CommandLineInterfaceTest::CommandLineInterfaceTest(&this->super_CommandLineInterfaceTest);
  (this->super_CommandLineInterfaceTest).super_CommandLineInterfaceTester.super_Test._vptr_Test =
       (_func_int **)&PTR__CommandLineInterfaceTest_PluginOutputDirectoryNotFoundError_Test_029fd0e0
  ;
  return;
}

Assistant:

TEST_F(CommandLineInterfaceTest, PluginOutputDirectoryNotFoundError) {
  CreateTempFile("foo.proto",
                 "syntax = \"proto2\";\n"
                 "message Foo {}\n");

  Run("protocol_compiler --plug_out=$tmpdir/nosuchdir "
      "--proto_path=$tmpdir foo.proto");

  ExpectErrorSubstring("nosuchdir/: No such file or directory");
}